

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::BeginRead(ColumnReader *this,data_ptr_t define_out,data_ptr_t repeat_out)

{
  ThriftFileTransport *this_00;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ThriftFileTransport *trans;
  TProtocol *in_stack_ffffffffffffffb8;
  __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffc0;
  
  duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffffb8);
  this_00 = (ThriftFileTransport *)
            std::
            __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*(in_stack_ffffffffffffffc0);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x56b694);
  ThriftFileTransport::SetLocation(this_00,in_RDI[9]);
  if ((in_RSI != 0) && (in_RDX != 0)) {
    (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void ColumnReader::BeginRead(data_ptr_t define_out, data_ptr_t repeat_out) {
	// we need to reset the location because multiple column readers share the same protocol
	auto &trans = reinterpret_cast<ThriftFileTransport &>(*protocol->getTransport());
	trans.SetLocation(chunk_read_offset);

	// Perform any skips that were not applied yet.
	if (define_out && repeat_out) {
		ApplyPendingSkips(define_out, repeat_out);
	}
}